

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int balance(BtCursor *pCur)

{
  u8 *puVar1;
  u8 *puVar2;
  byte bVar3;
  u8 uVar4;
  ushort uVar5;
  u32 uVar6;
  uint *puVar7;
  PgHdr *pPVar8;
  uint uVar9;
  long lVar10;
  u8 uVar11;
  u8 uVar12;
  i64 iVar13;
  undefined8 uVar14;
  u8 **ppuVar15;
  char cVar16;
  u16 uVar17;
  ushort uVar18;
  ushort uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  undefined1 *puVar23;
  ulong uVar24;
  Pgno PVar25;
  int nNew;
  MemPage **ppMVar26;
  int iNew;
  ulong uVar27;
  uint uVar28;
  long lVar29;
  MemPage **ppMVar30;
  MemPage *pMVar31;
  long lVar32;
  void *pvVar33;
  void *pvVar34;
  MemPage *pMVar35;
  int iVar36;
  ulong uVar37;
  MemPage *pMVar38;
  MemPage *pMVar39;
  BtShared *pBVar40;
  MemPage **ppMVar41;
  MemPage **ppMVar42;
  size_t __n;
  uint uVar43;
  ulong uVar44;
  MemPage *pMVar45;
  u8 *puVar46;
  bool bVar47;
  u8 *pCell;
  Pgno pgnoNew;
  int szNew [5];
  u8 abDone [5];
  MemPage *pNew;
  int rc;
  u16 szCell;
  MemPage *pChild;
  Pgno aPgOrder [5];
  u8 *apDiv [2];
  u16 aPgFlags [5];
  u8 aBalanceQuickSpace [13];
  Pgno aPgno [5];
  uint local_2ac;
  MemPage *local_2a8;
  MemPage **local_2a0;
  MemPage **local_298;
  MemPage **local_290;
  void *local_288;
  ulong local_280;
  uint local_274;
  MemPage *local_270;
  BtCursor *local_268;
  ulong local_260;
  MemPage *local_258;
  MemPage *local_250;
  MemPage *local_248;
  BtShared *local_240;
  uint local_234;
  MemPage *local_230;
  MemPage *local_228 [3];
  uint uStack_20c;
  Pgno local_208;
  uint local_204 [6];
  uint auStack_1ec [9];
  undefined4 local_1c8;
  undefined1 local_1c4;
  void *local_1c0;
  uint local_1b4;
  MemPage **local_1b0;
  undefined8 local_1a8;
  MemPage *local_1a0 [4];
  void *local_180;
  MemPage **local_178;
  CellInfo local_170;
  undefined1 local_158 [24];
  CellArray local_140;
  MemPage **local_d8;
  ulong local_d0;
  MemPage *local_c8;
  ulong local_c0;
  Pgno PStack_b8;
  uint local_b4 [7];
  long alStack_98 [3];
  uint *local_80;
  ulong local_78;
  long local_70;
  MemPage **local_68;
  u16 auStack_60 [5];
  u8 local_55 [4];
  u8 auStack_51 [9];
  Pgno aPStack_48 [6];
  
  local_78 = (ulong)(pCur->pBt->usableSize * 2) / 3;
  local_68 = pCur->apPage;
  local_178 = pCur->apPage + 1;
  pvVar33 = (void *)0x0;
  local_268 = pCur;
LAB_00178e75:
  cVar16 = pCur->iPage;
  lVar29 = (long)cVar16;
  pMVar35 = pCur->pPage;
  if ((-1 < pMVar35->nFree) || (iVar21 = btreeComputeFreeSpace(pMVar35), iVar21 == 0)) {
    if (cVar16 != '\0') {
      if ((pMVar35->nOverflow == '\0') && (pMVar35->nFree <= (int)local_78)) goto LAB_00179103;
      pMVar31 = pCur->apPage[lVar29 + -1];
      uVar18 = pCur->aiIdx[lVar29 + -1];
      local_70 = lVar29;
      uVar20 = sqlite3PagerWrite(pMVar31->pDbPage);
      if ((uVar20 == 0) && (uVar20 = 0, pMVar31->nFree < 0)) {
        uVar20 = btreeComputeFreeSpace(pMVar31);
      }
      pvVar34 = pvVar33;
      local_258 = pMVar31;
      if (uVar20 == 0) {
        if ((((pMVar35->intKeyLeaf != '\0') && (pMVar35->nOverflow == '\x01')) &&
            (pMVar35->aiOvfl[0] == pMVar35->nCell)) &&
           ((pMVar31->pgno != 1 && (pMVar31->nCell == uVar18)))) {
          if (pMVar35->nCell == 0) {
            uVar20 = 0xb;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11355);
          }
          else {
            pBVar40 = pMVar35->pBt;
            iVar21 = allocateBtreePage(pBVar40,(MemPage **)&local_1a8,&local_208,0,'\0');
            local_170.nKey = CONCAT44(local_170.nKey._4_4_,iVar21);
            if (iVar21 == 0) {
              local_228[0] = (MemPage *)pMVar35->apOvfl[0];
              local_158._0_2_ = (*pMVar35->xCellSize)(pMVar35,(u8 *)local_228[0]);
              pMVar31 = (MemPage *)CONCAT44(local_1a8._4_4_,(uint)local_1a8);
              zeroPage(pMVar31,0xd);
              local_140.nCell = 1;
              local_140.apCell = (u8 **)local_228;
              local_140.szCell = (u16 *)local_158;
              local_140.apEnd[0] = pMVar35->aDataEnd;
              local_140.ixNx[0] = 2;
              local_140.pRef = pMVar35;
              uVar20 = rebuildPage(&local_140,0,1,pMVar31);
              pMVar45 = local_258;
              local_170.nKey = CONCAT44(local_170.nKey._4_4_,uVar20);
              if (uVar20 == 0) {
                pMVar31->nFree =
                     (pBVar40->usableSize -
                     ((uint)(ushort)local_158._0_2_ + (uint)pMVar31->cellOffset)) + -2;
                if ((pBVar40->autoVacuum != '\0') &&
                   (ptrmapPut(pBVar40,local_208,'\x05',local_258->pgno,(int *)&local_170),
                   pMVar31->minLocal < (ushort)local_158._0_2_)) {
                  ptrmapPutOvflPtr(pMVar31,pMVar31,&local_228[0]->isInit,(int *)&local_170);
                }
                uVar44 = (ulong)(CONCAT11(pMVar35->aCellIdx[(ulong)pMVar35->nCell * 2 + -2],
                                          pMVar35->aCellIdx[(ulong)pMVar35->nCell * 2 + -1]) &
                                pMVar35->maskPage);
                uVar37 = 0;
                puVar1 = pMVar35->aData + uVar44;
                pMVar38 = (MemPage *)(pMVar35->aData + uVar44 + 2);
                do {
                  pMVar39 = pMVar38;
                  puVar46 = puVar1;
                  if (7 < uVar37) break;
                  uVar37 = uVar37 + 1;
                  puVar1 = puVar46 + 1;
                  pMVar38 = (MemPage *)&pMVar39->bBusy;
                } while ((char)*puVar46 < '\0');
                lVar29 = 4;
                do {
                  local_228[0] = pMVar39;
                  uVar4 = *(u8 *)((long)&local_228[0][-1].xParseCell + 7);
                  local_55[lVar29] = uVar4;
                  lVar29 = lVar29 + 1;
                  if (-1 < (char)uVar4) break;
                  pMVar39 = (MemPage *)&local_228[0]->bBusy;
                } while (local_228[0] < (MemPage *)(puVar46 + 10));
                if ((uint)local_170.nKey == 0) {
                  insertCell(pMVar45,(uint)pMVar45->nCell,local_55,(int)lVar29,(u8 *)0x0,
                             pMVar35->pgno,(int *)&local_170);
                }
                *(Pgno *)(pMVar45->aData + (ulong)pMVar45->hdrOffset + 8) =
                     local_208 >> 0x18 | (local_208 & 0xff0000) >> 8 | (local_208 & 0xff00) << 8 |
                     local_208 << 0x18;
              }
              if (pMVar31 != (MemPage *)0x0) {
                sqlite3PagerUnrefNotNull(pMVar31->pDbPage);
              }
              pCur = local_268;
              if (uVar20 != 0) goto LAB_0017930e;
            }
            uVar20 = (uint)local_170.nKey;
          }
          goto LAB_0017930e;
        }
        local_1c0 = pcache1Alloc(pCur->pBt->pageSize);
        pMVar31 = local_258;
        local_2ac = 0;
        local_1c8 = 0;
        local_1c4 = 0;
        local_140._0_8_ = local_140._0_8_ & 0xffffffff00000000;
        local_140.apCell = (u8 **)0x0;
        if (local_1c0 != (void *)0x0) {
          uVar20 = pCur->hints & 1;
          local_c0 = (ulong)uVar20;
          uVar43 = (uint)local_258->nCell + (uint)local_258->nOverflow;
          local_d0 = 0;
          if (1 < uVar43) {
            uVar28 = (uint)uVar18;
            if (uVar28 == 0) {
              local_d0 = 0;
            }
            else if (uVar43 == uVar28) {
              local_d0 = (ulong)((uVar43 + uVar20) - 2);
            }
            else {
              local_d0 = (ulong)(uVar28 - 1);
            }
            uVar43 = 2 - uVar20;
          }
          ppMVar30 = (MemPage **)(ulong)uVar43;
          uVar20 = ((int)local_d0 - (uint)local_258->nOverflow) + uVar43;
          if (uVar20 == local_258->nCell) {
            uVar44 = (ulong)local_258->hdrOffset + 8;
          }
          else {
            uVar44 = (ulong)(CONCAT11(local_258->aCellIdx[(long)(int)uVar20 * 2],
                                      local_258->aCellIdx[(long)(int)uVar20 * 2 + 1]) &
                            local_258->maskPage);
          }
          local_80 = (uint *)(local_258->aData + uVar44);
          local_240 = local_258->pBt;
          uVar20 = *local_80;
          local_274 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                      uVar20 << 0x18;
          local_2a0 = (MemPage **)CONCAT44(local_2a0._4_4_,local_274);
          local_288 = pvVar33;
          local_2ac = getAndInitPage(local_240,local_274,local_228 + (long)ppMVar30,(BtCursor *)0x0,
                                     0);
          ppMVar41 = (MemPage **)(ulong)(uVar43 + 1);
          if (local_2ac == 0) {
            __n = (size_t)(uVar43 * 8);
            local_d8 = ppMVar30;
            iVar21 = ((int)local_d0 + uVar43) * 2;
            local_260 = (long)(int)local_d0 - 1;
            local_1b0 = ppMVar30;
            ppMVar42 = ppMVar30;
            local_298 = ppMVar41;
            local_250 = pMVar35;
            local_234 = uVar43 + 1;
            do {
              iVar21 = iVar21 + -2;
              if ((local_228[(long)ppMVar42]->nFree < 0) &&
                 (local_2ac = btreeComputeFreeSpace(local_228[(long)ppMVar42]), local_2ac != 0)) {
                local_274 = (Pgno)local_2a0;
                local_2a8 = (MemPage *)0x0;
                memset(local_228,0,__n);
                pvVar33 = local_288;
                ppMVar41 = local_298;
                pCur = local_268;
                uVar43 = local_2ac;
                pMVar31 = local_2a8;
                goto LAB_00179294;
              }
              ppMVar30 = (MemPage **)((long)ppMVar42 + -1);
              if (ppMVar42 == (MemPage **)0x0) {
                local_274 = (Pgno)local_2a0;
                uVar20 = ((local_240->pageSize - 8) / 6 + 4) * local_234 + 3 & 0xfffffffc;
                local_140.apCell =
                     (u8 **)sqlite3Malloc((long)(int)(local_240->pageSize + uVar20 * 10));
                ppMVar41 = local_298;
                if ((MemPage **)local_140.apCell == (MemPage **)0x0) {
                  local_2ac = 7;
                  local_2a8 = (MemPage *)0x0;
                  pvVar33 = local_288;
                  pCur = local_268;
                  uVar43 = local_2ac;
                  pMVar31 = local_2a8;
                  goto LAB_00179294;
                }
                lVar29 = (long)(int)uVar20;
                local_270 = (MemPage *)((MemPage **)local_140.apCell + lVar29);
                local_140.szCell = (u16 *)local_270;
                local_230 = (MemPage *)(local_270->aiOvfl + lVar29 + -0xe);
                local_140.pRef = local_228[0];
                local_1b4 = (uint)local_228[0]->leaf;
                local_280 = (ulong)local_228[0]->leaf << 2;
                local_c8 = local_228[0];
                local_260 = (ulong)local_228[0]->intKeyLeaf;
                local_180 = (void *)((long)local_140.apCell + lVar29 * 10);
                ppMVar30 = (MemPage **)0x0;
                iVar21 = 0;
                iVar22 = 0;
                local_290 = (MemPage **)local_140.apCell;
                goto LAB_00179652;
              }
              if ((pMVar31->nOverflow == 0) ||
                 ((int)local_260 + (int)ppMVar42 != (uint)pMVar31->aiOvfl[0])) {
                puVar46 = pMVar31->aData;
                lVar29 = (long)(int)(iVar21 + (uint)pMVar31->nOverflow * -2);
                uVar18 = CONCAT11(pMVar31->aCellIdx[lVar29],pMVar31->aCellIdx[lVar29 + 1]) &
                         pMVar31->maskPage;
                puVar1 = puVar46 + uVar18;
                alStack_98[(long)ppMVar30] = (long)puVar1;
                uVar20 = *(uint *)(puVar46 + uVar18);
                local_2a0 = (MemPage **)
                            CONCAT44(local_2a0._4_4_,
                                     uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 |
                                     (uVar20 & 0xff00) << 8 | uVar20 << 0x18);
                uVar17 = (*pMVar31->xCellSize)(pMVar31,puVar1);
                uVar20 = (uint)uVar17;
                auStack_1ec[(long)ppMVar42] = (uint)uVar17;
                if ((local_240->btsFlags & 0xc) != 0) {
                  iVar22 = (int)puVar1 - *(int *)&pMVar31->aData;
                  iVar36 = iVar22 + (uint)uVar17;
                  local_270 = (MemPage *)CONCAT44(local_270._4_4_,iVar36);
                  local_290 = (MemPage **)CONCAT44(local_290._4_4_,local_240->usableSize);
                  local_2a8 = (MemPage *)(ulong)uVar17;
                  if ((int)local_240->usableSize < iVar36) {
                    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x114ba);
                    local_2ac = 0xb;
                    memset(local_228,0,__n);
                  }
                  else {
                    memcpy((void *)((long)iVar22 + (long)local_1c0),puVar1,(ulong)(uint)uVar17);
                    alStack_98[(long)ppMVar30] =
                         ((long)puVar1 - (long)pMVar31->aData) + (long)local_1c0;
                  }
                  uVar20 = (uint)local_2a8;
                  pMVar31 = local_258;
                  if ((int)local_290 < (int)(uint)local_270) {
                    local_274 = (Pgno)local_2a0;
                    local_2a8 = (MemPage *)0x0;
                    pvVar33 = local_288;
                    ppMVar41 = local_298;
                    pCur = local_268;
                    pMVar35 = local_250;
                    uVar43 = local_2ac;
                    pMVar31 = local_2a8;
                    goto LAB_00179294;
                  }
                }
                dropCell(pMVar31,((int)ppMVar42 + (int)local_260) - (uint)pMVar31->nOverflow,uVar20,
                         (int *)&local_2ac);
                pMVar35 = local_250;
              }
              else {
                puVar7 = (uint *)pMVar31->apOvfl[0];
                alStack_98[(long)ppMVar30] = (long)puVar7;
                uVar20 = *puVar7;
                local_2a0 = (MemPage **)
                            CONCAT44(local_2a0._4_4_,
                                     uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 |
                                     (uVar20 & 0xff00) << 8 | uVar20 << 0x18);
                uVar17 = (*pMVar31->xCellSize)(pMVar31,(u8 *)puVar7);
                auStack_1ec[(long)ppMVar42] = (uint)uVar17;
                pMVar31->nOverflow = '\0';
              }
              local_2ac = getAndInitPage(local_240,(Pgno)local_2a0,
                                         (MemPage **)((long)&local_230 + __n),(BtCursor *)0x0,0);
              __n = __n - 8;
              ppMVar42 = ppMVar30;
              ppMVar41 = local_298;
              pCur = local_268;
            } while (local_2ac == 0);
          }
          pvVar33 = local_288;
          local_274 = (Pgno)local_2a0;
          local_2a8 = (MemPage *)0x0;
          memset(local_228,0,(long)(int)ppMVar30 * 8 + 8);
          uVar43 = local_2ac;
          pMVar31 = local_2a8;
          goto LAB_00179294;
        }
        uVar20 = 7;
        goto LAB_001792f9;
      }
      goto LAB_0017930e;
    }
    if (pMVar35->nOverflow == '\0') goto LAB_00179103;
    local_140._0_8_ = (MemPage *)0x0;
    local_228[0] = (MemPage *)((ulong)local_228[0] & 0xffffffff00000000);
    pBVar40 = pMVar35->pBt;
    local_1a8._0_4_ = sqlite3PagerWrite(pMVar35->pDbPage);
    if ((uint)local_1a8 == 0) {
      local_1a8._0_4_ =
           allocateBtreePage(pBVar40,(MemPage **)&local_140,(Pgno *)local_228,pMVar35->pgno,'\0');
      copyNodeContent(pMVar35,(MemPage *)local_140._0_8_,(int *)&local_1a8);
      if (pBVar40->autoVacuum != '\0') {
        ptrmapPut(pBVar40,(Pgno)local_228[0],'\x05',pMVar35->pgno,(int *)&local_1a8);
      }
    }
    uVar14 = local_140._0_8_;
    uVar20 = (uint)local_1a8;
    if ((uint)local_1a8 == 0) {
      memcpy((u16 *)(local_140._0_8_ + 0x1c),pMVar35->aiOvfl,(ulong)((uint)pMVar35->nOverflow * 2));
      memcpy((u8 **)(uVar14 + 0x28),pMVar35->apOvfl,(ulong)pMVar35->nOverflow << 3);
      *(u8 *)(uVar14 + 0xc) = pMVar35->nOverflow;
      zeroPage(pMVar35,**(u8 **)(uVar14 + 0x50) & 0xfffffff7);
      *(Pgno *)(pMVar35->aData + (ulong)pMVar35->hdrOffset + 8) =
           (Pgno)local_228[0] >> 0x18 | ((Pgno)local_228[0] & 0xff0000) >> 8 |
           ((Pgno)local_228[0] & 0xff00) << 8 | (Pgno)local_228[0] << 0x18;
      *local_178 = (MemPage *)uVar14;
      uVar20 = 0;
    }
    else {
      *local_178 = (MemPage *)0x0;
      if ((MemPage *)local_140._0_8_ != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(*(DbPage **)(local_140._0_8_ + 0x70));
      }
    }
    bVar47 = true;
    if (uVar20 != 0) goto LAB_00179347;
    pCur->iPage = '\x01';
    pCur->ix = 0;
    pCur->aiIdx[0] = 0;
    pCur->apPage[0] = pMVar35;
    uVar20 = 0;
    ppMVar30 = local_178;
    goto LAB_0017933b;
  }
LAB_00179103:
  bVar47 = false;
  uVar20 = 0;
  goto LAB_00179347;
  while (ppMVar30 = (MemPage **)((long)ppMVar30 + 1), ppMVar30 != ppMVar41) {
LAB_00179652:
    pMVar35 = local_228[(long)ppMVar30];
    puVar1 = pMVar35->aData;
    if (*puVar1 == *local_c8->aData) {
      local_2a8 = (MemPage *)(ulong)pMVar35->nCell;
      uVar18 = pMVar35->maskPage;
      puVar46 = puVar1 + pMVar35->cellOffset;
      local_248 = (MemPage *)(long)iVar22;
      local_2a0 = ppMVar30;
      memset(local_270->aiOvfl + (long)((long)&local_248[-1].xCellSize + 2),0,
             (ulong)(((uint)pMVar35->nCell + (uint)pMVar35->nOverflow) * 2));
      pMVar31 = local_270;
      bVar3 = pMVar35->nOverflow;
      if (bVar3 != 0) {
        uVar19 = pMVar35->aiOvfl[0];
        if ((ushort)local_2a8 < uVar19) {
          bVar47 = false;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11515);
          local_2ac = 0xb;
          ppMVar41 = local_298;
          ppMVar30 = local_2a0;
          goto LAB_001798fa;
        }
        if (uVar19 != 0) {
          lVar29 = 0;
          do {
            local_290[(long)local_248->aiOvfl + lVar29 + -0x1c] =
                 (MemPage *)(puVar1 + (uVar18 & CONCAT11(*puVar46,puVar46[1])));
            puVar46 = puVar46 + 2;
            lVar29 = lVar29 + 1;
          } while ((uint)uVar19 != (uint)lVar29);
          iVar22 = iVar22 + (uint)lVar29;
        }
        uVar20 = (uint)bVar3;
        if (bVar3 < 2) {
          uVar20 = 1;
        }
        uVar44 = 0;
        do {
          local_290[(long)iVar22 + uVar44] = (MemPage *)pMVar35->apOvfl[uVar44];
          uVar44 = uVar44 + 1;
        } while (uVar20 != uVar44);
        iVar22 = iVar22 + (int)uVar44;
        local_140._0_8_ = (MemPage *)CONCAT44(local_140._4_4_,iVar22);
      }
      uVar19 = pMVar35->cellOffset;
      uVar5 = pMVar35->nCell;
      if (puVar46 < puVar1 + (ulong)uVar5 * 2 + (ulong)uVar19) {
        lVar29 = (long)iVar22;
        lVar32 = 0;
        do {
          puVar2 = puVar46 + lVar32;
          *(u8 **)((long)local_290 + lVar32 * 4 + lVar29 * 8) =
               puVar1 + (CONCAT11(*puVar2,puVar2[1]) & uVar18);
          iVar22 = iVar22 + 1;
          local_140.nCell = iVar22;
          lVar32 = lVar32 + 2;
        } while (puVar2 + 2 < puVar1 + (ulong)uVar5 * 2 + (ulong)uVar19);
      }
      *(int *)(local_158 + (long)local_2a0 * 4) = iVar22;
      if ((local_2a0 < local_1b0) && ((char)local_260 == '\0')) {
        uVar20 = auStack_1ec[(long)local_2a0 + 1] & 0xffff;
        local_270->aiOvfl[(long)iVar22 + -0xe] = (u16)auStack_1ec[(long)local_2a0 + 1];
        pvVar33 = (void *)((long)local_230->aiOvfl + (long)iVar21 + -0x1c);
        iVar21 = iVar21 + uVar20;
        memcpy(pvVar33,(void *)alStack_98[(long)local_2a0],(ulong)uVar20);
        pMVar45 = (MemPage *)((long)pvVar33 + local_280);
        local_290[iVar22] = pMVar45;
        uVar18 = pMVar31->aiOvfl[(long)iVar22 + -0xe] - (short)local_280;
        pMVar31->aiOvfl[(long)iVar22 + -0xe] = uVar18;
        if (pMVar35->leaf == '\0') {
          puVar1 = pMVar35->aData;
          uVar4 = puVar1[9];
          uVar11 = puVar1[10];
          uVar12 = puVar1[0xb];
          pMVar45->isInit = puVar1[8];
          pMVar45->bBusy = uVar4;
          pMVar45->intKey = uVar11;
          pMVar45->intKeyLeaf = uVar12;
        }
        else if (uVar18 < 4) {
          puVar23 = (undefined1 *)((long)iVar21 + (long)local_180);
          do {
            *puVar23 = 0;
            uVar18 = pMVar31->aiOvfl[(long)iVar22 + -0xe] + 1;
            pMVar31->aiOvfl[(long)iVar22 + -0xe] = uVar18;
            puVar23 = puVar23 + 1;
            iVar21 = iVar21 + 1;
          } while (uVar18 < 4);
        }
        iVar22 = iVar22 + 1;
        local_140.nCell = iVar22;
      }
      bVar47 = true;
      ppMVar41 = local_298;
      ppMVar30 = local_2a0;
    }
    else {
      bVar47 = false;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x114fd);
      local_2ac = 0xb;
    }
LAB_001798fa:
    if (!bVar47) {
      local_2a8 = (MemPage *)0x0;
      pvVar33 = local_288;
      pCur = local_268;
      pMVar35 = local_250;
      uVar43 = local_2ac;
      pMVar31 = local_2a8;
      goto LAB_00179294;
    }
  }
  local_180 = (void *)(local_280 & 0xffff);
  local_2a0 = (MemPage **)
              CONCAT44(local_2a0._4_4_,local_240->usableSize + (uint)(ushort)local_280 + -0xc);
  ppMVar30 = (MemPage **)0x0;
  iVar21 = 0;
  do {
    pMVar35 = local_228[(long)ppMVar30];
    local_140.apEnd[iVar21] = pMVar35->aDataEnd;
    uVar20 = *(uint *)(local_158 + (long)ppMVar30 * 4);
    local_140.ixNx[iVar21] = uVar20;
    iVar22 = 0;
    if ((iVar21 != 0) &&
       (iVar22 = iVar21 + -1, uVar20 != local_140.ixNx[(long)iVar21 + 0xffffffffffffffff])) {
      iVar22 = iVar21;
    }
    iVar21 = iVar22;
    if ((int)local_260 == 0) {
      iVar21 = iVar22 + 1;
      local_140.apEnd[(long)iVar22 + 1] = local_258->aDataEnd;
      local_140.ixNx[(long)iVar22 + 1] = uVar20 + 1;
    }
    auStack_1ec[(long)ppMVar30 + 1] = (Pgno)local_2a0 - pMVar35->nFree;
    if (pMVar35->nOverflow != '\0') {
      uVar44 = 0;
      do {
        uVar17 = (*pMVar35->xCellSize)(pMVar35,pMVar35->apOvfl[uVar44]);
        auStack_1ec[(long)ppMVar30 + 1] = (uint)uVar17 + auStack_1ec[(long)ppMVar30 + 1] + 2;
        uVar44 = uVar44 + 1;
      } while (uVar44 < pMVar35->nOverflow);
    }
    (&uStack_20c)[(long)ppMVar30 + 1] = uVar20;
    ppMVar30 = (MemPage **)((long)ppMVar30 + 1);
    iVar21 = iVar21 + 1;
  } while (ppMVar30 != local_298);
  local_230 = (MemPage *)CONCAT44(local_230._4_4_,local_2ac);
  local_270 = (MemPage *)CONCAT44(local_270._4_4_,local_140.nCell);
  local_290 = (MemPage **)(long)local_140.nCell;
  local_248 = (MemPage *)-(long)local_290;
  uVar37 = 0;
  uVar44 = (ulong)local_234;
  local_2a8 = (MemPage *)local_140.szCell;
  pMVar31 = (MemPage *)local_140.szCell;
  pMVar35 = local_250;
  do {
    uVar20 = auStack_1ec[uVar37 + 1];
    if ((int)(Pgno)local_2a0 < (int)uVar20) {
      local_280 = CONCAT44(local_280._4_4_,(int)uVar37 + 2);
      do {
        if ((long)(int)uVar44 <= (long)(uVar37 + 1)) {
          if (3 < uVar37) {
            auStack_1ec[uVar37 + 1] = uVar20;
            bVar47 = false;
            local_230 = (MemPage *)CONCAT44(local_230._4_4_,0xb);
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1157a,
                        "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
            pMVar31 = local_2a8;
            uVar20 = (uint)local_280;
            goto LAB_00179c1d;
          }
          auStack_1ec[uVar37 + 2] = 0;
          (&uStack_20c)[uVar37 + 2] = (uint)local_270;
          uVar44 = local_280 & 0xffffffff;
        }
        uVar43 = (&uStack_20c)[uVar37 + 1];
        uVar18 = pMVar31->aiOvfl[(long)(int)uVar43 + -0xf];
        if (uVar18 == 0) {
          uVar18 = computeCellSize(&local_140,uVar43 - 1);
          pMVar31 = local_2a8;
        }
        iVar21 = uVar18 + 2;
        if ((int)local_260 == 0) {
          iVar21 = 0;
          if ((int)uVar43 < (int)(uint)local_270) {
            uVar19 = pMVar31->aiOvfl[(long)(int)uVar43 + -0xe];
            if (uVar19 == 0) {
              uVar19 = computeCellSize(&local_140,uVar43);
              pMVar31 = local_2a8;
            }
            iVar21 = uVar19 + 2;
          }
        }
        auStack_1ec[uVar37 + 2] = auStack_1ec[uVar37 + 2] + iVar21;
        uVar20 = uVar20 - (uVar18 + 2);
        (&uStack_20c)[uVar37 + 1] = uVar43 - 1;
        pMVar35 = local_250;
      } while ((int)(Pgno)local_2a0 < (int)uVar20);
    }
    auStack_1ec[uVar37 + 1] = uVar20;
    uVar20 = (&uStack_20c)[uVar37 + 1];
    if ((int)uVar20 < (int)(uint)local_270) {
      bVar47 = true;
      local_280 = uVar44;
      lVar29 = (long)(int)uVar20;
      do {
        lVar32 = lVar29 + 1;
        uVar18 = pMVar31->aiOvfl[lVar29 + -0xe];
        if (uVar18 == 0) {
          uVar18 = computeCellSize(&local_140,uVar20);
          pMVar31 = local_2a8;
          uVar44 = local_280;
        }
        pvVar33 = local_288;
        ppMVar41 = local_298;
        iVar21 = uVar18 + 2;
        if ((int)(Pgno)local_2a0 < (int)(auStack_1ec[uVar37 + 1] + iVar21)) {
          if (bVar47) {
            if (uVar37 == 0) {
              uVar43 = 0;
            }
            else {
              uVar43 = (&uStack_20c)[uVar37];
            }
            bVar47 = true;
            if ((int)uVar20 <= (int)uVar43) {
              bVar47 = false;
              local_230 = (MemPage *)CONCAT44(local_230._4_4_,0xb);
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1159b,
                          "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
              pMVar31 = local_2a8;
              uVar44 = local_280;
            }
            goto LAB_00179c27;
          }
          break;
        }
        auStack_1ec[uVar37 + 1] = auStack_1ec[uVar37 + 1] + iVar21;
        (&uStack_20c)[uVar37 + 1] = uVar20 + 1;
        if (((int)local_260 == 0) && (iVar21 = 0, lVar32 < (long)local_290)) {
          uVar18 = pMVar31->aiOvfl[lVar29 + -0xd];
          if (uVar18 == 0) {
            uVar18 = computeCellSize(&local_140,uVar20 + 1);
            pMVar31 = local_2a8;
            uVar44 = local_280;
          }
          iVar21 = uVar18 + 2;
        }
        auStack_1ec[uVar37 + 2] = auStack_1ec[uVar37 + 2] - iVar21;
        bVar47 = lVar32 < (long)local_290;
        lVar10 = lVar29 + -0x1b;
        uVar20 = uVar20 + 1;
        lVar29 = lVar32;
      } while ((long)local_248->aiOvfl + lVar10 != 0);
    }
    bVar47 = true;
    uVar20 = (int)uVar37 + 1;
LAB_00179c1d:
    pvVar33 = local_288;
    uVar44 = (ulong)uVar20;
    ppMVar41 = local_298;
LAB_00179c27:
    if (!bVar47) {
      local_2ac = (uint)local_230;
      local_2a8 = (MemPage *)0x0;
      pCur = local_268;
      uVar43 = local_2ac;
      pMVar31 = local_2a8;
      goto LAB_00179294;
    }
    uVar37 = uVar37 + 1;
  } while ((long)uVar37 < (long)(int)uVar44);
  local_2ac = (uint)local_230;
  local_230 = (MemPage *)(ulong)((int)uVar44 - 1);
  iVar21 = (int)local_260;
  pMVar45 = local_230;
  pMVar38 = pMVar31;
  local_280 = uVar44;
  do {
    ppMVar30 = local_1b0;
    pCur = local_268;
    if ((int)pMVar45 < 1) {
      local_290 = (MemPage **)CONCAT44(local_290._4_4_,(uint)*local_c8->aData);
      if ((int)uVar44 < 1) {
        pMVar31 = (MemPage *)0x0;
        goto LAB_0017a2c4;
      }
      pMVar45 = (MemPage *)(uVar44 & 0xffffffff);
      ppMVar42 = (MemPage **)0x0;
      pMVar31 = (MemPage *)0x0;
      local_2a8 = pMVar45;
      goto LAB_0017a1a9;
    }
    uVar20 = auStack_1ec[(long)pMVar45];
    uVar43 = auStack_1ec[(long)&(pMVar45 + -1)[1].bBusy];
    uVar28 = (&uStack_20c)[(long)pMVar45];
    lVar29 = (long)(int)uVar28 - (local_260 & 0xffffffff);
    if (*(short *)((long)pMVar38 + lVar29 * 2) == 0) {
      computeCellSize(&local_140,(int)lVar29);
      pMVar38 = local_2a8;
      uVar44 = local_280;
    }
    local_290 = (MemPage **)(ulong)((uint)(pMVar45 == local_230) * 2 - 2);
    lVar29 = (long)(int)uVar28 + 1;
    local_248 = pMVar45;
    do {
      uVar28 = uVar28 - 1;
      if (pMVar38->aiOvfl[lVar29 + -0x10] == 0) {
        computeCellSize(&local_140,uVar28);
        pMVar38 = local_2a8;
        uVar44 = local_280;
        pMVar35 = local_250;
      }
      pCur = local_268;
      if ((uVar43 != 0) &&
         (((char)local_c0 != '\0' ||
          ((int)(((int)local_290 + uVar20) - (uint)pMVar38->aiOvfl[lVar29 + -0x10]) <
           (int)(*(ushort *)((long)pMVar31 + lVar29 * 2 + (-2 - (ulong)(uint)(iVar21 * 2))) + uVar43
                + 2))))) break;
      uVar43 = uVar43 + *(ushort *)((long)pMVar31 + lVar29 * 2 + (-2 - (ulong)(uint)(iVar21 * 2))) +
               2;
      uVar20 = (uVar20 - pMVar38->aiOvfl[lVar29 + -0x10]) - 2;
      (&uStack_20c)[(long)(pMVar45 + -1 + 1)] = uVar28;
      lVar29 = lVar29 + -1;
    } while (1 < lVar29);
    auStack_1ec[(long)&(local_248 + -1)[1].bBusy] = uVar43;
    auStack_1ec[(long)(pMVar45 + -1 + 1)] = uVar20;
    pMVar39 = pMVar45 + -1;
    uVar20 = 0;
    if (local_248 != (MemPage *)0x1) {
      uVar20 = (&uStack_20c)[(ulong)((int)local_248 - 2) + 1];
    }
    pMVar45 = (MemPage *)((long)&pMVar45[-1].xParseCell + 7);
  } while ((int)uVar20 < (int)(&uStack_20c)[(long)(pMVar39 + 1)]);
  local_2a8 = (MemPage *)0x0;
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x115c5);
  local_2ac = 0xb;
  pvVar33 = local_288;
  ppMVar41 = local_298;
  uVar43 = local_2ac;
  pMVar31 = local_2a8;
  goto LAB_00179294;
  while (ppMVar42 = (MemPage **)((long)ppMVar42 + 1), pMVar45 != (MemPage *)ppMVar42) {
LAB_0017a1a9:
    pBVar40 = local_240;
    if (ppMVar30 < ppMVar42) {
      PVar25 = 1;
      if ((char)local_c0 == '\0') {
        PVar25 = local_274;
      }
      local_2ac = allocateBtreePage(local_240,(MemPage **)&local_170,&local_274,PVar25,'\0');
      iVar13 = local_170.nKey;
      if (local_2ac == 0) {
        zeroPage((MemPage *)local_170.nKey,(int)local_290);
        local_1a0[(long)ppMVar42 + -1] = (MemPage *)iVar13;
        pMVar31 = (MemPage *)(ulong)((int)pMVar31 + 1);
        *(uint *)(local_158 + (long)ppMVar42 * 4) = (uint)local_270;
        pMVar45 = local_2a8;
        if ((pBVar40->autoVacuum == '\0') ||
           (ptrmapPut(pBVar40,*(Pgno *)(iVar13 + 4),'\x05',local_258->pgno,(int *)&local_2ac),
           pMVar45 = local_2a8, local_2ac == 0)) goto LAB_0017a2a1;
      }
      bVar47 = false;
      pMVar45 = local_2a8;
    }
    else {
      pMVar35 = local_228[(long)ppMVar42];
      local_1a0[(long)ppMVar42 + -1] = pMVar35;
      local_170.nKey = (i64)pMVar35;
      local_228[(long)ppMVar42] = (MemPage *)0x0;
      local_2ac = sqlite3PagerWrite(pMVar35->pDbPage);
      pMVar31 = (MemPage *)(ulong)((int)pMVar31 + 1);
      if (local_2ac == 0) {
LAB_0017a2a1:
        bVar47 = true;
      }
      else {
        bVar47 = false;
      }
    }
    pvVar33 = local_288;
    ppMVar41 = local_298;
    pMVar35 = local_250;
    uVar43 = local_2ac;
    if (!bVar47) goto LAB_00179294;
  }
LAB_0017a2c4:
  pMVar35 = local_250;
  pvVar33 = local_288;
  ppMVar41 = local_298;
  uVar20 = (uint)pMVar31;
  local_2a8 = pMVar31;
  if (0 < (int)uVar20) {
    uVar44 = 0;
    do {
      pMVar45 = local_1a0[uVar44 - 1];
      PVar25 = pMVar45->pgno;
      aPStack_48[uVar44] = PVar25;
      (&PStack_b8)[uVar44] = PVar25;
      auStack_60[uVar44] = pMVar45->pDbPage->flags;
      if (uVar44 != 0) {
        uVar37 = 0;
        do {
          if (aPStack_48[uVar37] == PVar25) {
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1160f);
            local_2ac = 0xb;
            uVar43 = local_2ac;
            pMVar31 = local_2a8;
            goto LAB_00179294;
          }
          uVar37 = uVar37 + 1;
        } while (uVar44 != uVar37);
      }
      uVar44 = uVar44 + 1;
    } while ((MemPage *)uVar44 != pMVar31);
  }
  pBVar40 = local_240;
  PVar25 = local_274;
  if (0 < (int)uVar20) {
    uVar44 = 0;
    do {
      uVar37 = 0;
      if (uVar20 != 1) {
        uVar24 = 1;
        uVar27 = 0;
        do {
          uVar37 = uVar24 & 0xffffffff;
          if ((&PStack_b8)[(int)uVar27] <= (&PStack_b8)[uVar24]) {
            uVar37 = uVar27;
          }
          uVar24 = uVar24 + 1;
          uVar27 = uVar37;
        } while (pMVar31 != (MemPage *)uVar24);
      }
      lVar29 = (long)(int)uVar37;
      PVar25 = (&PStack_b8)[lVar29];
      (&PStack_b8)[lVar29] = 0xffffffff;
      if (uVar44 != uVar37) {
        if ((long)uVar44 < lVar29) {
          pPVar8 = local_1a0[lVar29 + -1]->pDbPage;
          uVar6 = pBVar40->nPage;
          pPVar8->flags = 0;
          sqlite3PcacheMove(pPVar8,uVar6 + (int)uVar37 + 1);
        }
        pMVar35 = local_1a0[uVar44 - 1];
        pPVar8 = pMVar35->pDbPage;
        pPVar8->flags = auStack_60[lVar29];
        sqlite3PcacheMove(pPVar8,PVar25);
        pMVar35->pgno = PVar25;
        ppMVar30 = local_1b0;
        pBVar40 = local_240;
      }
      uVar44 = uVar44 + 1;
    } while ((MemPage *)uVar44 != pMVar31);
  }
  ppMVar41 = local_298;
  uVar44 = (ulong)(int)uVar20;
  ppMVar42 = (&local_1b0)[uVar44];
  uVar43 = *(uint *)((long)ppMVar42 + 4);
  *local_80 = uVar43 >> 0x18 | (uVar43 & 0xff0000) >> 8 | (uVar43 & 0xff00) << 8 | uVar43 << 0x18;
  if ((((ulong)local_290 & 8) == 0) && (local_234 != uVar20)) {
    ppMVar26 = local_228;
    if ((int)local_234 < (int)uVar20) {
      ppMVar26 = (MemPage **)&local_1a8;
    }
    pMVar35 = ppMVar42[10];
    puVar1 = ppMVar26[(long)ppMVar30]->aData;
    uVar4 = puVar1[9];
    uVar11 = puVar1[10];
    uVar12 = puVar1[0xb];
    pMVar35->leaf = puVar1[8];
    pMVar35->hdrOffset = uVar4;
    pMVar35->childPtrSize = uVar11;
    pMVar35->max1bytePayload = uVar12;
  }
  local_280 = uVar44;
  local_274 = PVar25;
  if (pBVar40->autoVacuum != '\0') {
    if (0 < (int)(uint)local_270) {
      bVar47 = (int)local_260 == 0;
      pMVar35 = (MemPage *)CONCAT44(local_1a8._4_4_,(uint)local_1a8);
      uVar27 = (ulong)((uint)pMVar35->nCell + (uint)pMVar35->nOverflow);
      uVar37 = 0;
      iVar21 = 0;
      local_290 = (MemPage **)((ulong)local_290 & 0xffffffff00000000);
      pMVar31 = pMVar35;
      do {
        if (uVar37 == uVar27) {
          lVar29 = (long)iVar21;
          ppMVar30 = local_228 + lVar29 + 1;
          ppMVar42 = local_1a0 + lVar29;
          do {
            lVar29 = lVar29 + 1;
            ppMVar26 = ppMVar30;
            if (lVar29 < (long)uVar44) {
              ppMVar26 = ppMVar42;
            }
            pMVar35 = *ppMVar26;
            uVar27 = (ulong)((int)uVar27 + (uint)bVar47 + (uint)pMVar35->nCell +
                            (uint)pMVar35->nOverflow);
            iVar21 = iVar21 + 1;
            ppMVar30 = ppMVar30 + 1;
            ppMVar42 = ppMVar42 + 1;
          } while (uVar37 == uVar27);
        }
        pMVar45 = (MemPage *)local_140.apCell[uVar37];
        lVar29 = (long)(int)local_290;
        if (uVar37 == (&uStack_20c)[lVar29 + 1]) {
          local_290 = (MemPage **)CONCAT44(local_290._4_4_,(int)local_290 + 1);
          pMVar31 = local_1a0[lVar29];
          if ((int)local_260 != 0) goto LAB_0017a582;
          iVar22 = 0x35;
        }
        else {
LAB_0017a582:
          if (((((int)local_2a8 <= iVar21) || (pMVar31->pgno != aPStack_48[iVar21])) ||
              (pMVar45 < (MemPage *)pMVar35->aData)) ||
             (iVar22 = 0, (MemPage *)pMVar35->aDataEnd <= pMVar45)) {
            local_270 = pMVar31;
            if ((char)local_1b4 == '\0') {
              uVar20._0_1_ = pMVar45->isInit;
              uVar20._1_1_ = pMVar45->bBusy;
              uVar20._2_1_ = pMVar45->intKey;
              uVar20._3_1_ = pMVar45->intKeyLeaf;
              local_248 = pMVar45;
              ptrmapPut(local_240,
                        uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                        uVar20 << 0x18,'\x05',pMVar31->pgno,(int *)&local_2ac);
              pMVar45 = local_248;
              uVar44 = local_280;
            }
            uVar18 = ((u16 *)((long)local_140.szCell + 0x1c))[uVar37 - 0xe];
            if (uVar18 == 0) {
              local_248 = pMVar45;
              uVar18 = computeCellSize(&local_140,(int)uVar37);
              pMVar45 = local_248;
              uVar44 = local_280;
            }
            if (local_270->minLocal < uVar18) {
              ptrmapPutOvflPtr(local_270,pMVar35,&pMVar45->isInit,(int *)&local_2ac);
              uVar44 = local_280;
            }
            iVar22 = (uint)(local_2ac != 0) << 2;
            pMVar31 = local_270;
          }
        }
        if ((iVar22 != 0x35) && (iVar22 != 0)) goto LAB_0017a674;
        uVar37 = uVar37 + 1;
      } while ((long)uVar37 < (long)local_140.nCell);
    }
    iVar22 = 0;
LAB_0017a674:
    uVar20 = (uint)local_2a8;
    uVar43 = local_2ac;
    pvVar33 = local_288;
    pCur = local_268;
    pMVar35 = local_250;
    if (iVar22 != 0) {
joined_r0x0017a9d5:
      local_2ac = uVar43;
      uVar43 = local_2ac;
      pMVar31 = local_2a8;
      local_288 = pvVar33;
      local_268 = pCur;
      local_250 = pMVar35;
      if (iVar22 != 4) goto LAB_001792f9;
      goto LAB_00179294;
    }
  }
  ppuVar15 = local_140.apCell;
  if (1 < (int)uVar20) {
    local_270 = (MemPage *)local_140.szCell;
    local_248 = (MemPage *)(ulong)((int)local_2a8 - 1);
    local_290 = (MemPage **)(local_d0 & 0xffffffff);
    lVar29 = 0;
    iVar21 = 0;
    do {
      pMVar35 = local_1a0[lVar29 + -1];
      lVar32 = (long)(int)(&uStack_20c)[lVar29 + 1];
      pMVar31 = (MemPage *)ppuVar15[lVar32];
      uVar20 = (uint)local_270->aiOvfl[lVar32 + -0xe] + (int)local_180;
      pMVar45 = (MemPage *)((long)iVar21 + (long)local_1c0);
      if (pMVar35->leaf == '\0') {
        puVar1 = pMVar35->aData;
        uVar4 = pMVar31->bBusy;
        uVar11 = pMVar31->intKey;
        uVar12 = pMVar31->intKeyLeaf;
        puVar1[8] = pMVar31->isInit;
        puVar1[9] = uVar4;
        puVar1[10] = uVar11;
        puVar1[0xb] = uVar12;
      }
      else if ((int)local_260 == 0) {
        pMVar31 = (MemPage *)((long)&pMVar31[-1].xParseCell + 4);
        if (local_270->aiOvfl[lVar32 + -0xe] == 4) {
          uVar17 = (*local_258->xCellSize)(local_258,(u8 *)pMVar31);
          uVar20 = (uint)uVar17;
        }
      }
      else {
        (*pMVar35->xParseCell)(pMVar35,(u8 *)ppuVar15[lVar32 + -1],&local_170);
        iVar22 = sqlite3PutVarint((uchar *)&pMVar45->pgno,local_170.nKey);
        uVar20 = iVar22 + 4;
        pMVar31 = pMVar45;
        pMVar45 = (MemPage *)0x0;
      }
      insertCell(local_258,(int)local_290 + (int)lVar29,&pMVar31->isInit,uVar20,&pMVar45->isInit,
                 pMVar35->pgno,(int *)&local_2ac);
      pvVar33 = local_288;
      ppMVar41 = local_298;
      pCur = local_268;
      pMVar35 = local_250;
      uVar43 = local_2ac;
      pMVar31 = local_2a8;
      if (local_2ac != 0) goto LAB_00179294;
      iVar21 = iVar21 + uVar20;
      lVar29 = lVar29 + 1;
    } while (local_248 != (MemPage *)lVar29);
  }
  iVar21 = (int)local_2a8;
  uVar28 = 1 - iVar21;
  uVar43 = local_2ac;
  if ((int)uVar28 < iVar21) {
    bVar47 = (int)local_260 == 0;
    uVar20 = (uint)bVar47;
    iVar36 = local_140.nCell;
    local_260 = CONCAT44(local_260._4_4_,local_208);
    iVar21 = iVar21 * 2 + -1;
    do {
      uVar9 = -uVar28;
      if (0 < (int)uVar28) {
        uVar9 = uVar28;
      }
      uVar44 = (ulong)uVar9;
      iVar22 = 0x3d;
      if ((*(char *)((long)&local_1c8 + uVar44) == '\0') &&
         ((-1 < (int)uVar28 ||
          (iVar22 = 0,
          (int)(&uStack_20c)[(int)uVar9] <= *(int *)(local_158 + ((long)(int)uVar9 + -1) * 4))))) {
        if (uVar28 == 0) {
          iNew = 0;
          iVar22 = 0;
          nNew = (int)local_260;
        }
        else {
          uVar43 = (uint)bVar47;
          iVar22 = iVar36;
          if (uVar9 <= (uint)local_d8) {
            iVar22 = *(int *)(local_158 + ((long)(int)uVar9 + -1) * 4) + uVar43;
          }
          iNew = (&uStack_20c)[(int)uVar9] + uVar43;
          nNew = (&uStack_20c)[uVar44 + 1] - iNew;
        }
        pMVar35 = local_1a0[uVar44 - 1];
        uVar43 = editPage(pMVar35,iVar22,iNew,nNew,&local_140);
        iVar22 = 4;
        if (uVar43 == 0) {
          *(undefined1 *)((long)&local_1c8 + uVar44) = 1;
          pMVar35->nFree = (Pgno)local_2a0 - auStack_1ec[uVar44 + 1];
          iVar22 = 0;
        }
      }
      if ((iVar22 != 0) &&
         (ppMVar41 = local_298, pvVar33 = local_288, pCur = local_268, pMVar35 = local_250,
         iVar22 != 0x3d)) goto joined_r0x0017a9d5;
      uVar28 = uVar28 + 1;
      iVar21 = iVar21 + -1;
    } while (iVar21 != 0);
  }
  pBVar40 = local_240;
  pCur = local_268;
  pvVar33 = local_288;
  ppMVar41 = local_298;
  local_2ac = uVar43;
  if ((((char)local_70 == '\x01') && (local_258->nCell == 0)) &&
     (pMVar35 = (MemPage *)CONCAT44(local_1a8._4_4_,(uint)local_1a8),
     (int)(uint)local_258->hdrOffset <= pMVar35->nFree)) {
    local_2ac = defragmentPage(pMVar35,-1);
    copyNodeContent(pMVar35,local_258,(int *)&local_2ac);
    pCur = local_268;
    pvVar33 = local_288;
    ppMVar41 = local_298;
    if (local_2ac == 0) {
      local_2ac = freePage2(pMVar35->pBt,pMVar35,pMVar35->pgno);
    }
  }
  else if (((0 < (int)local_2a8) && (local_240->autoVacuum != '\0')) && ((char)local_1b4 == '\0')) {
    local_2a0 = (MemPage **)((ulong)local_2a8 & 0xffffffff);
    ppMVar30 = (MemPage **)0x0;
    do {
      uVar20 = *(uint *)(local_1a0[(long)ppMVar30 - 1]->aData + 8);
      ptrmapPut(pBVar40,uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                        uVar20 << 0x18,'\x05',local_1a0[(long)ppMVar30 - 1]->pgno,(int *)&local_2ac)
      ;
      ppMVar30 = (MemPage **)((long)ppMVar30 + 1);
    } while (local_2a0 != ppMVar30);
  }
  pMVar35 = local_250;
  iVar21 = (int)local_2a8;
  iVar22 = (int)local_d8;
  uVar43 = local_2ac;
  pMVar31 = local_2a8;
  if (iVar21 <= iVar22) {
    local_2a0 = local_228 + local_280;
    lVar29 = 0;
    do {
      if (uVar43 == 0) {
        pMVar31 = local_2a0[lVar29];
        uVar43 = freePage2(pMVar31->pBt,pMVar31,pMVar31->pgno);
      }
      lVar29 = lVar29 + 1;
      pMVar31 = local_2a8;
    } while ((iVar22 - iVar21) + 1 != (int)lVar29);
  }
LAB_00179294:
  local_2a8 = pMVar31;
  local_2ac = uVar43;
  if ((MemPage **)local_140.apCell != (MemPage **)0x0) {
    sqlite3_free(local_140.apCell);
  }
  pMVar31 = local_2a8;
  ppMVar30 = (MemPage **)0x0;
  do {
    if (local_228[(long)ppMVar30] != (MemPage *)0x0) {
      sqlite3PagerUnrefNotNull(local_228[(long)ppMVar30]->pDbPage);
    }
    ppMVar30 = (MemPage **)((long)ppMVar30 + 1);
  } while (ppMVar41 != ppMVar30);
  uVar20 = local_2ac;
  if (0 < (int)pMVar31) {
    uVar44 = 0;
    do {
      if (local_1a0[uVar44 - 1] != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(local_1a0[uVar44 - 1]->pDbPage);
      }
      uVar44 = uVar44 + 1;
      uVar20 = local_2ac;
    } while (((ulong)pMVar31 & 0xffffffff) != uVar44);
  }
LAB_001792f9:
  pvVar34 = local_1c0;
  if (pvVar33 != (void *)0x0) {
    pcache1Free(pvVar33);
    pvVar34 = local_1c0;
  }
LAB_0017930e:
  pMVar35->nOverflow = '\0';
  if (pMVar35 != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull(pMVar35->pDbPage);
  }
  cVar16 = pCur->iPage + -1;
  pCur->iPage = cVar16;
  ppMVar30 = local_68 + cVar16;
  pvVar33 = pvVar34;
LAB_0017933b:
  pCur->pPage = *ppMVar30;
  bVar47 = true;
LAB_00179347:
  if ((!bVar47) || (uVar20 != 0)) {
    if (pvVar33 != (void *)0x0) {
      pcache1Free(pvVar33);
    }
    return uVar20;
  }
  goto LAB_00178e75;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  const int nMin = pCur->pBt->usableSize * 2 / 3;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage = pCur->iPage;
    MemPage *pPage = pCur->pPage;

    if( NEVER(pPage->nFree<0) && btreeComputeFreeSpace(pPage) ) break;
    if( iPage==0 ){
      if( pPage->nOverflow ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */ 
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          assert( pCur->pPage->nOverflow );
        }
      }else{
        break;
      }
    }else if( pPage->nOverflow==0 && pPage->nFree<=nMin ){
      break;
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK && pParent->nFree<0 ){
        rc = btreeComputeFreeSpace(pParent);
      }
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent 
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer. 
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 ); 
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          ** 
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below. 
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot() 
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been 
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used 
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the 
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}